

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Flatten_x86::forward_int8(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  size_t _elemsize;
  long lVar19;
  bool bVar20;
  long local_f0;
  long local_e8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  Mat local_78;
  
  uVar2 = bottom_blob->dims;
  if (uVar2 == 1) {
    ncnn::Mat::operator=(top_blob,bottom_blob);
  }
  else {
    iVar8 = bottom_blob->w;
    lVar11 = (long)iVar8;
    uVar3 = bottom_blob->h;
    uVar18 = (ulong)uVar3;
    uVar4 = bottom_blob->c;
    uVar10 = (ulong)uVar4;
    iVar17 = uVar3 * iVar8 * bottom_blob->d;
    iVar5 = bottom_blob->elempack;
    uVar12 = uVar4 * iVar5 * iVar17;
    bVar20 = (uVar12 & 7) == 0;
    _elemsize = bottom_blob->elemsize / (ulong)(long)iVar5 <<
                ((opt->use_packing_layout & bVar20) != 0U) * '\x03';
    if ((opt->use_packing_layout & bVar20) == 0) {
      iVar8 = Flatten::forward((Flatten *)
                               ((long)&this->_vptr_Flatten_x86 + (long)this->_vptr_Flatten_x86[-3]),
                               bottom_blob,top_blob,opt);
      return iVar8;
    }
    iVar13 = (int)uVar12 >> 3;
    if (iVar5 == 1 && (uVar2 ^ 2) == 0) {
      ncnn::Mat::operator=(top_blob,bottom_blob);
      top_blob->dims = 1;
      top_blob->w = iVar13;
      top_blob->h = 1;
      top_blob->cstep = (long)iVar13;
      top_blob->elemsize = _elemsize;
      top_blob->elempack = 8;
    }
    else {
      ncnn::Mat::create(top_blob,iVar13,_elemsize,8,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((uVar2 ^ 2) == 0 && iVar5 == 8) {
        iVar9 = 0;
        iVar13 = 0;
        if (0 < iVar8) {
          iVar13 = iVar8;
        }
        if ((int)uVar3 < 1) {
          uVar18 = 0;
        }
        lVar14 = lVar11;
        for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
          lVar16 = bottom_blob->elemsize * uVar15 * (long)bottom_blob->w;
          pvVar6 = bottom_blob->data;
          pvVar7 = top_blob->data;
          for (lVar19 = 0; iVar13 != (int)lVar19; lVar19 = lVar19 + 1) {
            puVar1 = (undefined1 *)((long)pvVar7 + lVar19 + lVar14);
            *(undefined1 *)((long)pvVar7 + lVar19 + iVar9) =
                 *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16);
            *puVar1 = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 1);
            puVar1[lVar11] = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 2);
            puVar1[lVar11 * 2] = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 3);
            puVar1[lVar11 * 3] = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 4);
            puVar1[lVar11 * 4] = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 5);
            puVar1[lVar11 * 5] = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 6);
            puVar1[lVar11 * 6] = *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar16 + 7);
          }
          iVar9 = iVar9 + iVar8 * 8;
          lVar14 = lVar14 + lVar11 * 8;
        }
      }
      if (1 < uVar2 - 3) {
        return 0;
      }
      lVar11 = (long)iVar17;
      if (iVar5 == 8) {
        iVar13 = 0;
        iVar8 = 0;
        if (0 < iVar17) {
          iVar8 = iVar17;
        }
        uVar18 = 0;
        if (0 < (int)uVar4) {
          uVar18 = uVar10;
        }
        lVar14 = lVar11 * 8;
        local_e8 = lVar11 * 2;
        local_f0 = lVar11 * 3;
        local_98 = lVar11 * 4;
        local_a0 = lVar11 * 5;
        local_a8 = lVar11 * 6;
        local_b0 = lVar11 * 7;
        local_b8 = lVar11;
        for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
          ncnn::Mat::channel(&local_78,bottom_blob,(int)uVar15);
          pvVar7 = local_78.data;
          ncnn::Mat::~Mat(&local_78);
          pvVar6 = top_blob->data;
          for (lVar16 = 0; iVar8 != (int)lVar16; lVar16 = lVar16 + 1) {
            *(undefined1 *)((long)pvVar6 + lVar16 + iVar13) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_b8) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 1);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_e8) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 2);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_f0) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 3);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_98) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 4);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_a0) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 5);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_a8) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 6);
            *(undefined1 *)((long)pvVar6 + lVar16 + local_b0) =
                 *(undefined1 *)((long)pvVar7 + lVar16 * 8 + 7);
          }
          iVar13 = iVar13 + iVar17 * 8;
          local_b8 = local_b8 + lVar14;
          local_e8 = local_e8 + lVar14;
          local_f0 = local_f0 + lVar14;
          local_98 = local_98 + lVar14;
          local_a0 = local_a0 + lVar14;
          local_a8 = local_a8 + lVar14;
          local_b0 = local_b0 + lVar14;
        }
      }
      if (iVar5 != 1) {
        return 0;
      }
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      if ((int)uVar4 < 1) {
        uVar10 = 0;
      }
      lVar14 = 0;
      for (uVar18 = 0; uVar18 != uVar10; uVar18 = uVar18 + 1) {
        ncnn::Mat::channel(&local_78,bottom_blob,(int)uVar18);
        pvVar7 = local_78.data;
        ncnn::Mat::~Mat(&local_78);
        pvVar6 = top_blob->data;
        for (lVar16 = 0; iVar17 != (int)lVar16; lVar16 = lVar16 + 1) {
          *(undefined1 *)((long)pvVar6 + lVar16 + lVar14) = *(undefined1 *)((long)pvVar7 + lVar16);
        }
        lVar14 = lVar14 + lVar11;
      }
    }
  }
  return 0;
}

Assistant:

int Flatten_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
        out_elempack = total % 8 == 0 ? 8 : 1;
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* ptr = bottom_blob.row<const signed char>(i);
                signed char* outptr0 = (signed char*)top_blob + w * i * 8;
                signed char* outptr1 = (signed char*)top_blob + w * (i * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + w * (i * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + w * (i * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + w * (i * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + w * (i * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + w * (i * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr0 = (signed char*)top_blob + size * q * 8;
                signed char* outptr1 = (signed char*)top_blob + size * (q * 8 + 1);
                signed char* outptr2 = (signed char*)top_blob + size * (q * 8 + 2);
                signed char* outptr3 = (signed char*)top_blob + size * (q * 8 + 3);
                signed char* outptr4 = (signed char*)top_blob + size * (q * 8 + 4);
                signed char* outptr5 = (signed char*)top_blob + size * (q * 8 + 5);
                signed char* outptr6 = (signed char*)top_blob + size * (q * 8 + 6);
                signed char* outptr7 = (signed char*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }

        if (elempack == 1) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* ptr = bottom_blob.channel(q);
                signed char* outptr = (signed char*)top_blob + size * q;

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}